

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen7TextureCalc::Fill2DTexOffsetAddress
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint8_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint32_t local_60;
  uint32_t local_54;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t VAlign;
  uint32_t ArrayQPitch;
  uint32_t Height1;
  uint32_t Height0;
  uint32_t Height;
  uint32_t i;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen7TextureCalc *this_local;
  
  if (pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    _Height = pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    if ((((pTexInfo->ArraySize < 2) && (pTexInfo->Type != RESOURCE_CUBE)) &&
        (((ulong)(pTexInfo->Flags).Gpu >> 3 & 1) == 0)) &&
       (((ulong)(pTexInfo->Flags).Gpu >> 4 & 1) == 0)) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = 0;
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
    }
    else {
      Height1 = pTexInfo->BaseHeight;
      CompressWidth = (pTexInfo->Alignment).VAlign;
      if ((((ulong)(pTexInfo->Flags).Gpu >> 6 & 1) == 0) &&
         (((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) == 0)) {
        local_54 = 1;
      }
      else {
        local_54 = (pTexInfo->MSAA).NumSamples;
      }
      ArrayQPitch = GmmTextureCalc::ExpandHeight
                              (&this->super_GmmTextureCalc,Height1,CompressWidth,local_54);
      if ((((ulong)(_Height->Flags).Gpu >> 6 & 1) == 0) &&
         (((ulong)(_Height->Flags).Gpu >> 0x1d & 1) == 0)) {
        local_60 = 1;
      }
      else {
        local_60 = (_Height->MSAA).NumSamples;
      }
      VAlign = GmmTextureCalc::ExpandHeight
                         (&this->super_GmmTextureCalc,Height1 >> 1,CompressWidth,local_60);
      if ((_Height->Alignment).ArraySpacingSingleLod == '\0') {
        CompressHeight = ArrayQPitch + VAlign + CompressWidth * 0xc;
      }
      else {
        CompressHeight = ArrayQPitch;
      }
      uVar1 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,_Height->Format);
      if (uVar1 == '\0') {
        if (((ulong)(_Height->Flags).Gpu >> 0x1d & 1) != 0) {
          CompressHeight = CompressHeight >> 1;
        }
      }
      else {
        GmmTextureCalc::GetCompressionBlockDimensions
                  (&this->super_GmmTextureCalc,_Height->Format,&local_38,&CompressDepth,&local_3c);
        CompressHeight = CompressHeight / CompressDepth;
      }
      if (((1 < (_Height->MSAA).NumSamples) && (((ulong)(_Height->Flags).Gpu >> 6 & 1) == 0)) &&
         (((ulong)(_Height->Flags).Gpu >> 0x1d & 1) == 0)) {
        CompressHeight = (_Height->MSAA).NumSamples * CompressHeight;
      }
      (_Height->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] =
           (ulong)CompressHeight * _Height->Pitch;
      (_Height->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch =
           (ulong)CompressHeight * _Height->Pitch;
    }
    for (Height0 = 0; Height0 <= _Height->MaxLod; Height0 = Height0 + 1) {
      iVar2 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[8])(this,_Height,(ulong)Height0);
      *(ulong *)(_Height->MmcHint + (ulong)Height0 * 8 + 0x80) = CONCAT44(extraout_var,iVar2);
    }
  }
  return;
}

Assistant:

void GmmLib::GmmGen7TextureCalc::Fill2DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);

    GMM_DPF_ENTER;

    // QPitch: Array Element-to-Element, or Cube Face-to-Face Pitch...
    // -------------------------------------------------------------------------
    // Note: Gen7 MSAA RT samples stored as contiguous array planes--
    // e.g. MSAA-4X'ed array elements A and B stored: A0 A1 A2 A3 B0 B1 B2 B3.
    // However, for GMM's purposes QPitch is still the distance between
    // elements--not the distance between samples.
    // -------------------------------------------------------------------------
    if((pTexInfo->ArraySize <= 1) &&
       (pTexInfo->Type != RESOURCE_CUBE) &&
       !(pTexInfo->Flags.Gpu.ColorSeparation ||
         pTexInfo->Flags.Gpu.ColorSeparationRGBX))
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = 0;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = 0;
    }
    else
    {
        uint32_t Height, Height0, Height1, ArrayQPitch, VAlign;

        Height = pTexInfo->BaseHeight;

        VAlign = pTexInfo->Alignment.VAlign;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);
        Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

        if(!pTexInfo->Alignment.ArraySpacingSingleLod)
        {
            // QPitch = (h0 + h1 + 12j) * pitch
            ArrayQPitch = Height0 + Height1 + 12 * VAlign;
        }
        else // SURFACE_STATE: Surface Array Spacing: ARYSPC_LOD0
        {
            // QPitch = h0 * pitch
            ArrayQPitch = Height0;
        }

        if(GmmIsCompressed(pGmmLibContext, pTexInfo->Format))
        {
            uint32_t CompressHeight, CompressWidth, CompressDepth;

            GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

            ArrayQPitch /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            ArrayQPitch /= 2;
        }

        if((pTexInfo->MSAA.NumSamples > 1) && !(pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil))
        {
            // Gen7 MSAA (non-Depth/Stencil) RT samples stored as array planes;
            // QPitch still element-to-element, not sample-to-sample.
            ArrayQPitch *= pTexInfo->MSAA.NumSamples;
        }

        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = ArrayQPitch * pTexInfo->Pitch;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = ArrayQPitch * pTexInfo->Pitch;
    }

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get2DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}